

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADB.cpp
# Opt level: O2

uint8_t __thiscall Apple::IIgs::ADB::GLU::get_modifier_status(GLU *this)

{
  return this->registers_[6];
}

Assistant:

uint8_t GLU::get_modifier_status() {
	// b7:		1 = command key pressed; 0 = not.
	// b6:		option key.
	// b5:		1 = modifier key latch has been updated, no key has been pressed; 0 = not.
	// b4:		any numeric keypad key.
	// b3:		a key is down.
	// b2:		caps lock is pressed.
	// b1:		control key.
	// b0:		shift key.
	return registers_[6];
}